

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_bfset_32_ai(void)

{
  uint uVar1;
  sbyte sVar2;
  uint uVar3;
  uint address;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
    return;
  }
  uVar1 = m68ki_read_imm_16();
  if ((uVar1 >> 0xb & 1) == 0) {
    uVar5 = uVar1 >> 6 & 0x1f;
  }
  else {
    uVar5 = m68ki_cpu.dar[uVar1 >> 6 & 7];
  }
  if ((uVar1 & 0x20) != 0) {
    uVar1 = m68ki_cpu.dar[uVar1 & 7];
  }
  address = (int)uVar5 / 8 + m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] + -1 +
            (uint)((uVar5 & 0x80000007) < 0x80000001);
  uVar3 = uVar1 - 1 & 0x1f;
  uVar4 = -1 << (~(byte)uVar3 & 0x1f);
  sVar2 = (sbyte)(uVar5 & 7);
  uVar6 = uVar4 >> sVar2;
  uVar1 = m68ki_read_32_fc(address,m68ki_address_space | m68ki_cpu.s_flag);
  m68ki_cpu.not_z_flag = uVar6 & uVar1;
  m68ki_cpu.n_flag = (uVar1 << sVar2) >> 0x18;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  m68ki_write_32_fc(address,m68ki_cpu.s_flag | 1,uVar6 | uVar1);
  if (0x20 < (uVar5 & 7) + uVar3 + 1) {
    uVar4 = uVar4 & 0xff;
    uVar1 = m68ki_read_8_fc(address + 4,m68ki_address_space | m68ki_cpu.s_flag);
    m68ki_cpu.not_z_flag = m68ki_cpu.not_z_flag | uVar1 & uVar4;
    m68ki_write_8_fc(address + 4,m68ki_cpu.s_flag | 1,uVar4 | uVar1);
    return;
  }
  return;
}

Assistant:

static void m68k_op_bfset_32_ai(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		sint offset = (word2>>6)&31;
		uint width = word2;
		uint mask_base;
		uint data_long;
		uint mask_long;
		uint data_byte = 0;
		uint mask_byte = 0;
		uint ea = EA_AY_AI_8();


		if(BIT_B(word2))
			offset = MAKE_INT_32(REG_D[offset&7]);
		if(BIT_5(word2))
			width = REG_D[width&7];

		/* Offset is signed so we have to use ugly math =( */
		ea += offset / 8;
		offset %= 8;
		if(offset < 0)
		{
			offset += 8;
			ea--;
		}
		width = ((width-1) & 31) + 1;


		mask_base = MASK_OUT_ABOVE_32(0xffffffff << (32 - width));
		mask_long = mask_base >> offset;

		data_long = m68ki_read_32(ea);
		FLAG_N = NFLAG_32(data_long << offset);
		FLAG_Z = data_long & mask_long;
		FLAG_V = VFLAG_CLEAR;
		FLAG_C = CFLAG_CLEAR;

		m68ki_write_32(ea, data_long | mask_long);

		if((width + offset) > 32)
		{
			mask_byte = MASK_OUT_ABOVE_8(mask_base);
			data_byte = m68ki_read_8(ea+4);
			FLAG_Z |= (data_byte & mask_byte);
			m68ki_write_8(ea+4, data_byte | mask_byte);
		}
		return;
	}
	m68ki_exception_illegal();
}